

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr Term_xtra_x11(wchar_t n,wchar_t v)

{
  errr eVar1;
  wchar_t v_local;
  wchar_t n_local;
  
  switch(n) {
  case L'\x01':
    v_local = CheckEvent(v != L'\0');
    break;
  case L'\x02':
    do {
      eVar1 = CheckEvent(false);
    } while (eVar1 == 0);
    v_local = L'\0';
    break;
  case L'\x03':
    Infowin_wipe();
    v_local = L'\0';
    break;
  default:
    v_local = L'\x01';
    break;
  case L'\x06':
    Metadpy_update(L'\x01',L'\0',L'\0');
    v_local = L'\0';
    break;
  case L'\a':
    Metadpy_do_beep();
    v_local = L'\0';
    break;
  case L'\t':
    v_local = CheckEvent(false);
    break;
  case L'\n':
    v_local = Term_xtra_x11_react();
    break;
  case L'\f':
    v_local = Term_xtra_x11_level(v);
    break;
  case L'\r':
    if (L'\0' < v) {
      usleep(v * 1000);
    }
    v_local = L'\0';
  }
  return v_local;
}

Assistant:

static errr Term_xtra_x11(int n, int v)
{
	/* Handle a subset of the legal requests */
	switch (n)
	{
		/* Make a noise */
		case TERM_XTRA_NOISE: Metadpy_do_beep(); return (0);

		/* Flush the output XXX XXX */
		case TERM_XTRA_FRESH: Metadpy_update(1, 0, 0); return (0);

		/* Process random events XXX */
		case TERM_XTRA_BORED: return (CheckEvent(0));

		/* Process Events XXX */
		case TERM_XTRA_EVENT: return (CheckEvent(v));

		/* Flush the events XXX */
		case TERM_XTRA_FLUSH: while (!CheckEvent(false)); return (0);

		/* Handle change in the "level" */
		case TERM_XTRA_LEVEL: return (Term_xtra_x11_level(v));

		/* Clear the screen */
		case TERM_XTRA_CLEAR: Infowin_wipe(); return (0);

		/* Delay for some milliseconds */
		case TERM_XTRA_DELAY:
			if (v > 0) usleep(1000 * v);
			return (0);

		/* React to changes */
		case TERM_XTRA_REACT: return (Term_xtra_x11_react());
	}

	/* Unknown */
	return (1);
}